

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture1DArray::generate
          (Texture1DArray *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  PtrData<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_> data;
  GLenum dataType;
  IVec3 *context_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  Texture1DArray *pTVar3;
  int *piVar4;
  Texture1DArray *pTVar5;
  PixelBufferAccess *pPVar6;
  Texture1DArray *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  DefaultDeleter<glu::Texture1DArray> local_65 [13];
  PtrData<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_> local_58;
  PtrData<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_> *local_48;
  long local_38;
  Functions *gl;
  GLenum local_28;
  GLenum GStack_24;
  bool generateMipmaps_local;
  GLenum type_local;
  GLenum format_local;
  IVec3 *size_local;
  RenderContext *context_local;
  Texture1DArray *this_local;
  
  gl._7_1_ = generateMipmaps;
  local_28 = type;
  GStack_24 = format;
  _type_local = size;
  size_local = (IVec3 *)context;
  context_local = (RenderContext *)this;
  iVar1 = (*context->_vptr_RenderContext[3])();
  local_38 = CONCAT44(extraout_var,iVar1);
  pTVar3 = (Texture1DArray *)operator_new(0x68);
  context_00 = size_local;
  dVar2 = GStack_24;
  dataType = local_28;
  piVar4 = tcu::Vector<int,_3>::x(size);
  glu::Texture1DArray::Texture1DArray(pTVar3,(RenderContext *)context_00,dVar2,dataType,*piVar4,2);
  de::DefaultDeleter<glu::Texture1DArray>::DefaultDeleter(local_65);
  de::details::MovePtr<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::MovePtr();
  local_48 = de::details::MovePtr::operator_cast_to_PtrData(&local_58,(MovePtr *)pTVar3);
  data._8_8_ = in_stack_ffffffffffffff10;
  data.ptr = in_stack_ffffffffffffff08;
  de::details::MovePtr<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::operator=
            (&this->m_texture,data);
  de::details::MovePtr<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::~MovePtr
            ((MovePtr<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_> *)&local_58);
  pTVar3 = de::details::UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>
                     );
  pTVar5 = glu::Texture1DArray::getRefTexture(pTVar3);
  tcu::Texture1DArray::allocLevel(pTVar5,0);
  pTVar3 = de::details::UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>
                     );
  pTVar5 = glu::Texture1DArray::getRefTexture(pTVar3);
  tcu::Texture1DArray::allocLevel(pTVar5,1);
  dVar2 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar2,"glu::Texture1DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x114);
  pTVar3 = de::details::UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>
                     );
  pTVar5 = glu::Texture1DArray::getRefTexture(pTVar3);
  pPVar6 = tcu::TextureLevelPyramid::getLevel(&pTVar5->super_TextureLevelPyramid,0);
  tcu::Vector<float,_4>::Vector(&local_78,1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_88,0.0,0.0,0.0,1.0);
  tcu::fillWithGrid(pPVar6,4,&local_78,&local_88);
  dVar2 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar2,"glu::Texture1DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x118);
  pTVar3 = de::details::UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>
                     );
  pTVar5 = glu::Texture1DArray::getRefTexture(pTVar3);
  pPVar6 = tcu::TextureLevelPyramid::getLevel(&pTVar5->super_TextureLevelPyramid,1);
  tcu::Vector<float,_4>::Vector(&local_98,0.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_a8,1.0,0.0,0.0,1.0);
  tcu::fillWithGrid(pPVar6,4,&local_98,&local_a8);
  dVar2 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar2,"glu::Texture1DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x11c);
  pTVar3 = de::details::UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>
                     );
  glu::Texture1DArray::upload(pTVar3);
  dVar2 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar2,"glu::Texture1DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x11f);
  (**(code **)(local_38 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::Texture1DArray::generate(const glu::RenderContext& context, tcu::IVec3 size,
														glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	DE_UNREF(generateMipmaps);

	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::Texture1DArray>(new glu::Texture1DArray(context, format, type, size.x(), 2));

	m_texture->getRefTexture().allocLevel(0);
	m_texture->getRefTexture().allocLevel(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1DArray error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 4, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1DArray error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(1), 4, tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1DArray error occurred");

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1DArray error occurred");

	gl.activeTexture(GL_TEXTURE0);
}